

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotCreateUpdateForm.cpp
# Opt level: O0

Slot * __thiscall SlotCreateUpdateForm::save(SlotCreateUpdateForm *this)

{
  int passedId;
  Slot *this_00;
  int id;
  Slot *temp;
  SlotCreateUpdateForm *this_local;
  
  this_00 = (Slot *)operator_new(0x970);
  Slot::Slot(this_00,&this->requestedBy,&this->room,&this->startTime,&this->endTime,this->reason,
             this->approved);
  if ((this->super_ModelForm<Slot>).instance != (Slot *)0x0) {
    passedId = Model<Slot>::getId(&((this->super_ModelForm<Slot>).instance)->super_Model<Slot>);
    (*(((this->super_ModelForm<Slot>).instance)->super_Model<Slot>)._vptr_Model[1])();
    Model<Slot>::setId((Model<Slot> *)this_00,passedId);
  }
  (**(this_00->super_Model<Slot>)._vptr_Model)();
  return this_00;
}

Assistant:

Slot &SlotCreateUpdateForm::save() {
    Slot *temp;
    temp = new Slot(requestedBy, room, startTime, endTime, reason, approved);
    if (instance) {
        int id = instance->getId();
        instance->remove();
        temp->setId(id);
    }
    temp->save();
    return *temp;
}